

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_clear_fd(intptr_t fd,uint8_t is_open)

{
  undefined1 *puVar1;
  char cVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  long lVar5;
  long lVar6;
  undefined8 *ptr;
  long lVar7;
  undefined8 uVar8;
  code *pcVar9;
  undefined8 *puVar10;
  fio_defer_task_s task;
  long *__ptr;
  fio_data_s *pfVar11;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar12;
  fio_packet_s *tmp;
  uint uVar13;
  ulong uVar14;
  long *plVar15;
  long lVar16;
  char *pcVar17;
  fio_lock_i ret;
  timespec local_118;
  void *local_108;
  fio_rw_hook_s *local_100;
  long local_f8;
  void *local_f0;
  long *local_e8;
  void *local_e0;
  undefined8 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pfVar11 = fio_data;
  lVar16 = fd * 0xa8;
  LOCK();
  pcVar17 = (char *)((long)fio_data + lVar16 + 0x6e);
  cVar2 = *pcVar17;
  *pcVar17 = '\x01';
  UNLOCK();
  if (cVar2 != '\0') {
    pcVar17 = (char *)((long)pfVar11 + lVar16 + 0x6e);
    do {
      local_118.tv_sec = 0;
      local_118.tv_nsec = 1;
      nanosleep(&local_118,(timespec *)0x0);
      LOCK();
      cVar2 = *pcVar17;
      *pcVar17 = '\x01';
      UNLOCK();
    } while (cVar2 != '\0');
  }
  pfVar11 = fio_data;
  local_d8 = (undefined8 *)((long)fio_data + lVar16 + 0x40);
  lVar5 = *(long *)((long)fio_data + lVar16 + 0xb8);
  lVar6 = *(long *)((long)fio_data + lVar16 + 200);
  local_e8 = *(long **)((long)fio_data + lVar16 + 0xd0);
  local_f0 = *(void **)((long)fio_data + lVar16 + 0xd8);
  ptr = (undefined8 *)*local_d8;
  local_e0 = *(void **)((long)fio_data + lVar16 + 0x58);
  lVar7 = *(long *)((long)fio_data + lVar16 + 0xa8);
  uVar8 = *(undefined8 *)((long)fio_data + lVar16 + 0xb0);
  local_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  uStack_bc = 0;
  local_b8 = 0;
  uStack_b4 = 0;
  local_b0 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uVar3 = *(undefined1 *)((long)fio_data + lVar16 + 0x6c);
  cVar2 = *(char *)((long)fio_data + lVar16 + 0x6d);
  uVar4 = *(undefined1 *)((long)fio_data + lVar16 + 0x6e);
  local_100 = &FIO_DEFAULT_RW_HOOKS;
  *local_d8 = 0;
  *(undefined8 **)((long)pfVar11 + lVar16 + 0x48) = local_d8;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0x68) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x60) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x50) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x58) = 0;
  *(undefined1 *)((long)pfVar11 + lVar16 + 0x6c) = uVar3;
  *(char *)((long)pfVar11 + lVar16 + 0x6d) = cVar2 + '\x01';
  *(undefined1 *)((long)pfVar11 + lVar16 + 0x6e) = uVar4;
  *(uint8_t *)((long)pfVar11 + lVar16 + 0x6f) = is_open;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0xa0) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x90) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x98) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x80) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x88) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x70) = 0;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0x78) = 0;
  *(fio_rw_hook_s **)((long)pfVar11 + lVar16 + 0xa8) = &FIO_DEFAULT_RW_HOOKS;
  *(undefined8 *)((long)pfVar11 + lVar16 + 0xe0) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xd0) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xd4) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xd8) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xdc) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xc0) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xc4) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 200) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xcc) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xb0) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xb4) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xb8) = 0;
  *(undefined4 *)((long)pfVar11 + lVar16 + 0xbc) = 0;
  uVar14 = (ulong)pfVar11->max_protocol_fd;
  if ((long)uVar14 < fd) {
    pfVar11->max_protocol_fd = (uint32_t)fd;
  }
  else {
    uVar13 = pfVar11->max_protocol_fd;
    while ((uVar14 = (ulong)uVar13, uVar13 != 0 &&
           (*(char *)((long)pfVar11 + uVar14 * 0xa8 + 0x6f) == '\0'))) {
      uVar13 = uVar13 - 1;
      pfVar11->max_protocol_fd = uVar13;
    }
  }
  LOCK();
  puVar1 = (undefined1 *)((long)pfVar11 + lVar16 + 0x6e);
  uVar3 = *puVar1;
  *puVar1 = 0;
  UNLOCK();
  local_118.tv_sec = CONCAT71(local_118.tv_sec._1_7_,uVar3);
  __ptr = local_e8;
  if ((lVar7 != 0) && (pcVar9 = *(code **)(lVar7 + 0x20), pcVar9 != (code *)0x0)) {
    local_f8 = lVar16;
    (*pcVar9)(uVar8,uVar14,uVar3,CONCAT71((int7)((ulong)local_d8 >> 8),uVar3));
    lVar16 = local_f8;
    __ptr = local_e8;
  }
  while (local_f8 = lVar16, local_e8 = __ptr, ptr != (undefined8 *)0x0) {
    puVar10 = (undefined8 *)*ptr;
    (*(code *)ptr[2])(ptr[3]);
    fio_free(ptr);
    ptr = puVar10;
    lVar16 = local_f8;
    __ptr = local_e8;
  }
  if ((lVar5 != 0) && (0 < lVar6 && __ptr != (long *)0x0)) {
    plVar15 = __ptr;
    do {
      if (*plVar15 != 0) {
        (*(code *)plVar15[1])();
      }
      plVar15 = plVar15 + 2;
    } while (plVar15 < __ptr + lVar6 * 2);
  }
  free(local_f0);
  free(__ptr);
  iVar12 = extraout_EAX;
  if ((local_e0 != (void *)0x0) && (*(long *)((long)local_e0 + 0x18) != 0)) {
    local_118.tv_nsec = (ulong)*(byte *)((long)&fio_data[1].thread_ids.obj + lVar16 + 5) | fd << 8;
    local_118.tv_sec = (__time_t)deferred_on_close;
    local_108 = local_e0;
    task.arg1 = (void *)local_118.tv_nsec;
    task.func = deferred_on_close;
    task.arg2 = local_e0;
    fio_defer_push_task_fn(task,&task_queue_normal);
    iVar12 = extraout_EAX_00;
  }
  if (4 < FIO_LOG_LEVEL) {
    pcVar17 = "open";
    if (is_open == '\0') {
      pcVar17 = "closed";
    }
    FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:333): FD %d re-initialized (state: %p-%s)."
                   ,fd & 0xffffffff,
                   (ulong)*(byte *)((long)&fio_data[1].thread_ids.obj + lVar16 + 5) | fd << 8,
                   pcVar17);
    iVar12 = extraout_EAX_01;
  }
  return iVar12;
}

Assistant:

static inline int fio_clear_fd(intptr_t fd, uint8_t is_open) {
  fio_packet_s *packet;
  fio_protocol_s *protocol;
  fio_rw_hook_s *rw_hooks;
  void *rw_udata;
  fio_uuid_links_s links;
  fio_lock(&(fd_data(fd).sock_lock));
  links = fd_data(fd).links;
  packet = fd_data(fd).packet;
  protocol = fd_data(fd).protocol;
  rw_hooks = fd_data(fd).rw_hooks;
  rw_udata = fd_data(fd).rw_udata;
  fd_data(fd) = (fio_fd_data_s){
      .open = is_open,
      .sock_lock = fd_data(fd).sock_lock,
      .protocol_lock = fd_data(fd).protocol_lock,
      .rw_hooks = (fio_rw_hook_s *)&FIO_DEFAULT_RW_HOOKS,
      .counter = fd_data(fd).counter + 1,
      .packet_last = &fd_data(fd).packet,
  };
  if (fio_data->max_protocol_fd < fd) {
    fio_data->max_protocol_fd = fd;
  } else {
    while (fio_data->max_protocol_fd &&
           !fd_data(fio_data->max_protocol_fd).open)
      --fio_data->max_protocol_fd;
  }
  fio_unlock(&(fd_data(fd).sock_lock));
  if (rw_hooks && rw_hooks->cleanup)
    rw_hooks->cleanup(rw_udata);
  while (packet) {
    fio_packet_s *tmp = packet;
    packet = packet->next;
    fio_packet_free(tmp);
  }
  if (fio_uuid_links_count(&links)) {
    FIO_SET_FOR_LOOP(&links, pos) {
      if (pos->hash)
        pos->obj((void *)pos->hash);
    }
  }
  fio_uuid_links_free(&links);
  if (protocol && protocol->on_close) {
    fio_defer(deferred_on_close, (void *)fd2uuid(fd), protocol);
  }
  FIO_LOG_DEBUG("FD %d re-initialized (state: %p-%s).", (int)fd,
                (void *)fd2uuid(fd), (is_open ? "open" : "closed"));
  return 0;
}